

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_list.cpp
# Opt level: O0

double __thiscall ExprEval::Engine::NodeList::calculate(NodeList *this,size_t index)

{
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_1b0;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_1a8;
  const_iterator local_1a0;
  undefined1 local_198 [8];
  Node node_1;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_140;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_138;
  const_iterator local_130;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_128;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_120;
  const_iterator local_118;
  Node *local_110;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_108;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_100;
  const_iterator local_f8;
  undefined1 local_f0 [8];
  Node node;
  Expression subexpr;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_68;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_60;
  const_iterator local_58;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_50;
  __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
  local_48;
  const_iterator local_40;
  Exception *e;
  double local_20;
  double ans;
  size_t index_local;
  NodeList *this_local;
  
  this->m_beg = index;
  this->m_end = index + 1;
  ans = (double)index;
  index_local = (size_t)this;
  local_20 = calc(this,index,0);
  if ((this->m_cache).type == Expression) {
    local_50._M_current =
         (Node *)std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::begin
                           (&this->m_nodes);
    local_48 = __gnu_cxx::
               __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
               ::operator+(&local_50,this->m_beg);
    __gnu_cxx::
    __normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
    ::__normal_iterator<ExprEval::Engine::Node*>
              ((__normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
                *)&local_40,&local_48);
    local_68._M_current =
         (Node *)std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::begin
                           (&this->m_nodes);
    local_60 = __gnu_cxx::
               __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
               ::operator+(&local_68,this->m_end);
    __gnu_cxx::
    __normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
    ::__normal_iterator<ExprEval::Engine::Node*>
              ((__normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
                *)&local_58,&local_60);
    std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::erase
              (&this->m_nodes,local_40,local_58);
    (this->m_cache).type = Empty;
    Expression::Expression((Expression *)&node.field_0x48);
    local_20 = Expression::evaluate((Expression *)&node.field_0x48,&(this->m_cache).expression);
    Node::Node((Node *)local_f0);
    Node::set((Node *)local_f0,local_20);
    local_108._M_current =
         (Node *)std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::begin
                           (&this->m_nodes);
    local_100 = __gnu_cxx::
                __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
                ::operator+(&local_108,this->m_beg);
    __gnu_cxx::
    __normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
    ::__normal_iterator<ExprEval::Engine::Node*>
              ((__normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
                *)&local_f8,&local_100);
    local_110 = (Node *)std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>
                        ::insert(&this->m_nodes,local_f8,(value_type *)local_f0);
    Node::~Node((Node *)local_f0);
    Expression::~Expression((Expression *)&node.field_0x48);
  }
  else {
    local_128._M_current =
         (Node *)std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::begin
                           (&this->m_nodes);
    local_120 = __gnu_cxx::
                __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
                ::operator+(&local_128,this->m_beg);
    __gnu_cxx::
    __normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
    ::__normal_iterator<ExprEval::Engine::Node*>
              ((__normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
                *)&local_118,&local_120);
    local_140._M_current =
         (Node *)std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::begin
                           (&this->m_nodes);
    local_138 = __gnu_cxx::
                __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
                ::operator+(&local_140,this->m_end);
    __gnu_cxx::
    __normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
    ::__normal_iterator<ExprEval::Engine::Node*>
              ((__normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
                *)&local_130,&local_138);
    node_1._72_8_ =
         std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::erase
                   (&this->m_nodes,local_118,local_130);
    Node::Node((Node *)local_198);
    Node::set((Node *)local_198,local_20);
    local_1b0._M_current =
         (Node *)std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::begin
                           (&this->m_nodes);
    local_1a8 = __gnu_cxx::
                __normal_iterator<ExprEval::Engine::Node_*,_std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>_>
                ::operator+(&local_1b0,this->m_beg);
    __gnu_cxx::
    __normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
    ::__normal_iterator<ExprEval::Engine::Node*>
              ((__normal_iterator<ExprEval::Engine::Node_const*,std::vector<ExprEval::Engine::Node,std::allocator<ExprEval::Engine::Node>>>
                *)&local_1a0,&local_1a8);
    std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::insert
              (&this->m_nodes,local_1a0,(value_type *)local_198);
    Node::~Node((Node *)local_198);
  }
  return local_20;
}

Assistant:

double NodeList::calculate(size_t index){
            // std::cout<<"Index: "<<index<<'\n';
            m_beg = index;
            m_end = index + 1;

            double ans;
            try
            {
                ans = calc(index);
            }
            catch(const Exception& e)
            {
                // std::cerr << e.what() << '\n';
                throw e;
            }
            // std::cout<<"beg: "<<m_beg<<", end: "<<m_end<<'\n';
            if(m_cache.type == NodeType::Expression){
                // std::cout<<"replacing with "<<m_cache.expression<<'\n';
                // std::cout<<" from ["<<m_beg<<", "<<m_end<<"), size: "<<m_nodes.size()<<'\n';
                m_nodes.erase(m_nodes.begin()+m_beg, m_nodes.begin()+m_end);
                m_cache.type = NodeType::Empty;

                ExprEval::Expression subexpr;
                ans = subexpr.evaluate(m_cache.expression);

                Node node;
                node.set(ans);
                m_nodes.insert(m_nodes.begin()+m_beg, node);
                // std::cout<<"replacing with the number: "<<ans<<'\n';
            } else{
                m_nodes.erase(m_nodes.begin()+m_beg, m_nodes.begin()+m_end);
                
                Node node;
                node.set(ans);
                m_nodes.insert(m_nodes.begin()+m_beg, node);
            }
            // std::cout<<"final ans: "<<ans<<'\n';
            return ans;
        }